

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

Vec4 __thiscall glcts::BlendDarken(glcts *this,Vec4 *src,Vec4 *dst)

{
  uint uVar1;
  Vec4 VVar2;
  Vec4 rgb;
  Vec4 local_18;
  
  uVar1 = -(uint)(src->m_data[0] <= dst->m_data[0]);
  local_18.m_data[0] = (float)(~uVar1 & (uint)dst->m_data[0] | (uint)src->m_data[0] & uVar1);
  uVar1 = -(uint)(src->m_data[1] <= dst->m_data[1]);
  local_18.m_data[1] = (float)(~uVar1 & (uint)dst->m_data[1] | (uint)src->m_data[1] & uVar1);
  uVar1 = -(uint)(src->m_data[2] <= dst->m_data[2]);
  local_18.m_data[2] = (float)(~uVar1 & (uint)dst->m_data[2] | (uint)src->m_data[2] & uVar1);
  local_18.m_data[3] = 0.0;
  VVar2 = Blend(this,&local_18,src,dst);
  return (Vec4)VVar2.m_data;
}

Assistant:

static tcu::Vec4 BlendDarken(const tcu::Vec4& src, const tcu::Vec4& dst)
{
	tcu::Vec4 rgb(de::min(src[0], dst[0]), de::min(src[1], dst[1]), de::min(src[2], dst[2]), 0.f);

	return Blend(rgb, src, dst);
}